

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_poly(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL ref_cell;
  REF_STATUS RVar2;
  uint uVar3;
  FILE *__stream;
  long lVar4;
  REF_INT cell;
  int cell_00;
  ulong uVar5;
  REF_INT RVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  REF_DBL area;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_DBL normal [3];
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_DBL center [3];
  REF_INT nodes [27];
  uint local_134;
  uint local_128;
  double local_100;
  REF_INT *local_f8;
  REF_INT *local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  int local_d0;
  int local_cc;
  double local_c8;
  double local_c0;
  double local_b8;
  int local_a8 [30];
  
  ref_node = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x3ef,
           "ref_export_poly","unable to open file");
    local_134 = 2;
  }
  else {
    fprintf(__stream,"%d  %d  %d  %d\n",(ulong)(uint)ref_node->n,3,0,0);
    local_134 = ref_node_compact(ref_node,&local_f0,&local_f8);
    if (local_134 == 0) {
      if (0 < ref_node->n) {
        uVar5 = 0;
        do {
          pRVar1 = ref_node->real;
          lVar4 = (long)local_f8[uVar5];
          fprintf(__stream,"%d  %.16e  %.16e  %.16e\n",pRVar1[lVar4 * 0xf],pRVar1[lVar4 * 0xf + 1],
                  pRVar1[lVar4 * 0xf + 2],uVar5 & 0xffffffff);
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)ref_node->n);
      }
      ref_cell = ref_grid->cell[3];
      lVar4 = (long)ref_cell->node_per;
      local_128 = 0;
      fprintf(__stream,"%d  %d\n",(ulong)(uint)ref_cell->n);
      if (0 < ref_cell->max) {
        iVar7 = 0;
        do {
          RVar2 = ref_cell_nodes(ref_cell,iVar7,local_a8);
          if (RVar2 == 0) {
            fprintf(__stream,"1 0 1\n%d  %d %d %d  %d\n",lVar4,(ulong)(uint)local_f0[local_a8[0]],
                    (ulong)(uint)local_f0[local_a8[1]],(ulong)(uint)local_f0[local_a8[2]],
                    local_a8[3]);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < ref_cell->max);
      }
      ref_export_faceid_range(ref_grid,&local_cc,&local_d0);
      if (local_cc <= local_d0) {
        local_128 = 0;
        iVar7 = local_cc;
        do {
          if (ref_cell->max < 1) {
            cell_00 = -1;
            dVar9 = -1.0;
          }
          else {
            cell_00 = -1;
            RVar6 = 0;
            dVar9 = -1.0;
            do {
              RVar2 = ref_cell_nodes(ref_cell,RVar6,local_a8);
              if ((RVar2 == 0) && (local_a8[lVar4] == iVar7)) {
                uVar3 = ref_node_tri_area(ref_node,local_a8,&local_100);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x41a,"ref_export_poly",(ulong)uVar3,"area");
                  local_134 = uVar3;
                  goto LAB_00193f25;
                }
                if (dVar9 < local_100) {
                  dVar9 = local_100;
                  cell_00 = RVar6;
                }
              }
              RVar6 = RVar6 + 1;
            } while (RVar6 < ref_cell->max);
          }
          if (cell_00 != -1) {
            uVar3 = ref_cell_nodes(ref_cell,cell_00,local_a8);
            if (uVar3 == 0) {
              uVar3 = ref_node_tri_normal(ref_node,local_a8,&local_e8);
              if (uVar3 == 0) {
                uVar3 = ref_math_normalize(&local_e8);
                if (uVar3 == 0) {
                  if (dVar9 < 0.0) {
                    dVar9 = sqrt(dVar9);
                  }
                  else {
                    dVar9 = SQRT(dVar9);
                  }
                  if (1e-12 < dVar9 * 0.0001) {
                    local_128 = local_128 + 1;
                  }
                  goto LAB_00193f0e;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x424,"ref_export_poly",(ulong)uVar3,"norm");
                local_134 = uVar3;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x423,"ref_export_poly",(ulong)uVar3,"normal");
                local_134 = uVar3;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x422,"ref_export_poly",(ulong)uVar3,"tri nodes");
              local_134 = uVar3;
            }
LAB_00193f25:
            bVar8 = false;
            goto LAB_00193f30;
          }
LAB_00193f0e:
          bVar8 = iVar7 != local_d0;
          iVar7 = iVar7 + 1;
        } while (bVar8);
      }
      fprintf(__stream,"%d\n",(ulong)local_128);
      bVar8 = true;
      if (local_cc <= local_d0) {
        local_128 = 0;
        iVar7 = local_cc;
        do {
          if (ref_cell->max < 1) {
            RVar6 = -1;
            dVar9 = -1.0;
          }
          else {
            RVar6 = -1;
            cell = 0;
            dVar9 = -1.0;
            do {
              RVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
              if ((RVar2 == 0) && (local_a8[lVar4] == iVar7)) {
                uVar3 = ref_node_tri_area(ref_node,local_a8,&local_100);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x432,"ref_export_poly",(ulong)uVar3,"area");
                  local_134 = uVar3;
                  goto LAB_00193f2e;
                }
                if (dVar9 < local_100) {
                  dVar9 = local_100;
                  RVar6 = cell;
                }
              }
              cell = cell + 1;
            } while (cell < ref_cell->max);
          }
          if (RVar6 == -1) goto LAB_00193ceb;
          uVar3 = ref_cell_nodes(ref_cell,RVar6,local_a8);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x43a,"ref_export_poly",(ulong)uVar3,"tri nodes");
            local_134 = uVar3;
LAB_00193f2e:
            bVar8 = false;
            goto LAB_00193f30;
          }
          uVar3 = ref_node_tri_normal(ref_node,local_a8,&local_e8);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x43b,"ref_export_poly",(ulong)uVar3,"normal");
            local_134 = uVar3;
            goto LAB_00193f2e;
          }
          uVar3 = ref_math_normalize(&local_e8);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x43c,"ref_export_poly",(ulong)uVar3,"norm");
            local_134 = uVar3;
            goto LAB_00193f2e;
          }
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          dVar9 = dVar9 * 0.0001;
          if (1e-12 < dVar9) {
            uVar3 = ref_node_tri_centroid(ref_node,local_a8,&local_c8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x43f,"ref_export_poly",(ulong)uVar3,"center");
              local_134 = uVar3;
              goto LAB_00193f2e;
            }
            fprintf(__stream,"%d  %.16e  %.16e  %.16e\n",local_c8 - local_e8 * dVar9,
                    local_c0 - local_e0 * dVar9,local_b8 - dVar9 * local_d8,(ulong)local_128);
            local_128 = local_128 + 1;
          }
LAB_00193ceb:
          bVar8 = iVar7 != local_d0;
          iVar7 = iVar7 + 1;
        } while (bVar8);
        bVar8 = true;
      }
LAB_00193f30:
      if (bVar8) {
        fwrite("0\n",2,1,__stream);
        if (local_f8 != (REF_INT *)0x0) {
          free(local_f8);
        }
        if (local_f0 != (REF_INT *)0x0) {
          free(local_f0);
        }
        fclose(__stream);
        local_134 = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x3f8,"ref_export_poly",(ulong)local_134,"compact");
    }
  }
  return local_134;
}

Assistant:

REF_FCN static REF_STATUS ref_export_poly(REF_GRID ref_grid,
                                          const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT dim, attr, mark;
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  /* Part 1 - node list */
  nnode = ref_node_n(ref_node);
  dim = 3;
  attr = 0;
  mark = 0;
  fprintf(file, "%d  %d  %d  %d\n", nnode, dim, attr, mark);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++)
    fprintf(file, "%d  %.16e  %.16e  %.16e\n", node,
            ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));

  /* Part 2 - facet list */
  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  ntri = ref_cell_n(ref_cell);
  mark = 1;
  fprintf(file, "%d  %d\n", ntri, mark);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(file, "1 0 1\n%d  %d %d %d  %d\n", node_per, o2n[nodes[0]],
            o2n[nodes[1]], o2n[nodes[2]], nodes[3]);
  }

  /* Part 3 hole - list */
  /* create one hole point for each convex edge,
     expect right hand triangle to point into domain */
  {
    REF_INT faceid, min_faceid, max_faceid;
    REF_INT nhole, largest_triangle;
    REF_DBL area, max_area, normal[3], offset, center[3], hole[3];
    RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");
    nhole = 0;
    for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
      max_area = -1.0;
      largest_triangle = REF_EMPTY;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
          if (area > max_area) {
            max_area = area;
            largest_triangle = cell;
          }
        }
      }
      if (REF_EMPTY != largest_triangle) {
        RSS(ref_cell_nodes(ref_cell, largest_triangle, nodes), "tri nodes");
        RSS(ref_node_tri_normal(ref_node, nodes, normal), "normal");
        RSS(ref_math_normalize(normal), "norm");
        offset = 1.0e-4 * sqrt(max_area);
        if (offset > 1.0e-12) {
          nhole += 1;
        }
      }
    }
    fprintf(file, "%d\n", nhole);
    nhole = 0;
    for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
      max_area = -1.0;
      largest_triangle = REF_EMPTY;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
          if (area > max_area) {
            max_area = area;
            largest_triangle = cell;
          }
        }
      }
      if (REF_EMPTY != largest_triangle) {
        RSS(ref_cell_nodes(ref_cell, largest_triangle, nodes), "tri nodes");
        RSS(ref_node_tri_normal(ref_node, nodes, normal), "normal");
        RSS(ref_math_normalize(normal), "norm");
        offset = 1.0e-4 * sqrt(max_area);
        if (offset > 1.0e-12) {
          RSS(ref_node_tri_centroid(ref_node, nodes, center), "center");
          hole[0] = center[0] - offset * normal[0];
          hole[1] = center[1] - offset * normal[1];
          hole[2] = center[2] - offset * normal[2];
          fprintf(file, "%d  %.16e  %.16e  %.16e\n", nhole, hole[0], hole[1],
                  hole[2]);
          nhole += 1;
        }
      }
    }
  }

  /* Part 4 - region attributes list */
  fprintf(file, "0\n"); /* no regions */

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}